

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ChainstateManager::GenerateCoinbaseCommitment
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ChainstateManager *this,CBlock *block,CBlockIndex *pindexPrev)

{
  CScript *this_00;
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  uchar *puVar4;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  undefined1 auStack_118 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret;
  CTxOut out;
  CMutableTransaction tx;
  uint256 witnessroot;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = GetWitnessCommitmentIndex(block);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&ret,0x20,(value_type_conflict3 *)&tx,(allocator_type *)&out);
  if (iVar2 == -1) {
    BlockWitnessMerkleRoot(&witnessroot,block,(bool *)0x0);
    tx.version = 0;
    tx.nLockTime = 0;
    tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    CSHA256::CSHA256((CSHA256 *)&tx);
    CSHA256::Write((CSHA256 *)&tx,(uchar *)&witnessroot,0x20);
    CSHA256::Write((CSHA256 *)&tx,
                   ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
    output.m_size = 0x20;
    output.m_data = (uchar *)&witnessroot;
    CHash256::Finalize((CHash256 *)&tx,output);
    CTxOut::CTxOut(&out);
    this_00 = &out.scriptPubKey;
    out.nValue = 0;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&this_00->super_CScriptBase,0x26);
    uVar3 = this_00;
    if (0x1c < out.scriptPubKey.super_CScriptBase._size) {
      uVar3 = out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    }
    (((CScript *)uVar3)->super_CScriptBase)._union.direct[0] = 'j';
    uVar3 = out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    if (out.scriptPubKey.super_CScriptBase._size < 0x1d) {
      uVar3 = &out.scriptPubKey.super_CScriptBase._union;
    }
    *(char *)(uVar3 + 1) = '$';
    uVar3 = out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    if (out.scriptPubKey.super_CScriptBase._size < 0x1d) {
      uVar3 = &out.scriptPubKey.super_CScriptBase._union;
    }
    *(char *)(uVar3 + 2) = -0x56;
    uVar3 = out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    if (out.scriptPubKey.super_CScriptBase._size < 0x1d) {
      uVar3 = &out.scriptPubKey.super_CScriptBase._union;
    }
    *(char *)(uVar3 + 3) = '!';
    uVar3 = out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    if (out.scriptPubKey.super_CScriptBase._size < 0x1d) {
      uVar3 = &out.scriptPubKey.super_CScriptBase._union;
    }
    *(char *)(uVar3 + 4) = -0x57;
    uVar3 = out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    if (out.scriptPubKey.super_CScriptBase._size < 0x1d) {
      uVar3 = &out.scriptPubKey.super_CScriptBase._union;
    }
    *(char *)(uVar3 + 5) = -0x13;
    uVar3 = out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    if (out.scriptPubKey.super_CScriptBase._size < 0x1d) {
      uVar3 = &out.scriptPubKey.super_CScriptBase._union;
    }
    puVar4 = (uchar *)(uVar3 + 6);
    *(undefined8 *)(puVar4 + 0x10) = witnessroot.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)(puVar4 + 0x18) = witnessroot.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)puVar4 = witnessroot.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)(puVar4 + 8) = witnessroot.super_base_blob<256U>.m_data._M_elems._8_8_;
    uVar3 = this_00;
    if (0x1c < out.scriptPubKey.super_CScriptBase._size) {
      uVar3 = out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
      out.scriptPubKey.super_CScriptBase._size = out.scriptPubKey.super_CScriptBase._size - 0x1d;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tx,(iterator)uVar3,
               (uchar *)(uVar3 + (long)(int)out.scriptPubKey.super_CScriptBase._size),
               (allocator_type *)auStack_118);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (__return_storage_ptr__,&tx);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
    CMutableTransaction::CMutableTransaction
              (&tx,(((block->vtx).
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back(&tx.vout,&out);
    std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)auStack_118);
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((block->vtx).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)auStack_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_118 + 8));
    CMutableTransaction::~CMutableTransaction(&tx);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&this_00->super_CScriptBase);
  }
  UpdateUncommittedBlockStructures(this,block,pindexPrev);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> ChainstateManager::GenerateCoinbaseCommitment(CBlock& block, const CBlockIndex* pindexPrev) const
{
    std::vector<unsigned char> commitment;
    int commitpos = GetWitnessCommitmentIndex(block);
    std::vector<unsigned char> ret(32, 0x00);
    if (commitpos == NO_WITNESS_COMMITMENT) {
        uint256 witnessroot = BlockWitnessMerkleRoot(block, nullptr);
        CHash256().Write(witnessroot).Write(ret).Finalize(witnessroot);
        CTxOut out;
        out.nValue = 0;
        out.scriptPubKey.resize(MINIMUM_WITNESS_COMMITMENT);
        out.scriptPubKey[0] = OP_RETURN;
        out.scriptPubKey[1] = 0x24;
        out.scriptPubKey[2] = 0xaa;
        out.scriptPubKey[3] = 0x21;
        out.scriptPubKey[4] = 0xa9;
        out.scriptPubKey[5] = 0xed;
        memcpy(&out.scriptPubKey[6], witnessroot.begin(), 32);
        commitment = std::vector<unsigned char>(out.scriptPubKey.begin(), out.scriptPubKey.end());
        CMutableTransaction tx(*block.vtx[0]);
        tx.vout.push_back(out);
        block.vtx[0] = MakeTransactionRef(std::move(tx));
    }
    UpdateUncommittedBlockStructures(block, pindexPrev);
    return commitment;
}